

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpSocketImpl::Delete(TcpSocketImpl *this)

{
  type local_20;
  thread local_18;
  TcpSocketImpl *local_10;
  TcpSocketImpl *this_local;
  
  local_20.this = this;
  local_10 = this;
  std::thread::thread<TcpSocketImpl::Delete()::__0,,void>(&local_18,&local_20);
  std::thread::detach();
  std::thread::~thread(&local_18);
  return;
}

Assistant:

void TcpSocketImpl::Delete()
{
    thread([&]()
        {
            if (m_pBkRef == nullptr)
            {
                delete this;
                return;
            }
            TcpSocket* pSock = dynamic_cast<TcpSocket*>(m_pBkRef);
            lock_guard<mutex> lock(s_mxClientSocket);

            auto it = find_if(begin(s_lstClientSocket), end(s_lstClientSocket), [&](auto& item) noexcept { return item.get() == pSock; });
            if (it != end(s_lstClientSocket))
                s_lstClientSocket.erase(it);
            else
                delete pSock;
        }).detach();
}